

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void __thiscall kratos::GeneratorGraphVisitor::~GeneratorGraphVisitor(GeneratorGraphVisitor *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002b4518;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x50);
  return;
}

Assistant:

void visit(Generator *generator) override {
        auto *parent_node = g_->get_node(generator);
        for (auto const &child : generator->get_child_generators()) {
            auto *child_node = g_->get_node(child.get());
            if (child_node->parent != nullptr)
                throw InternalException(::format("{0} already has a parent",
                                                 child_node->parent->generator->instance_name));
            child_node->parent = parent_node;
            parent_node->children.emplace(child_node->generator);
        }
    }